

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofiletools.cpp
# Opt level: O2

string * __thiscall
libcellml::generatorProfileAsString_abi_cxx11_
          (string *__return_storage_ptr__,libcellml *this,GeneratorProfilePtr *generatorProfile)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  string *__rhs;
  string *psVar4;
  string sStack_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if ((generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)::
       TRUE_VALUE_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                                   ::TRUE_VALUE_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                ::TRUE_VALUE_abi_cxx11_,"true",(allocator<char> *)&sStack_608);
    __cxa_atexit(std::__cxx11::string::~string,
                 &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                         ::TRUE_VALUE_abi_cxx11_);
  }
  if ((generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)::
       FALSE_VALUE_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                                   ::FALSE_VALUE_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                ::FALSE_VALUE_abi_cxx11_,"false",(allocator<char> *)&sStack_608);
    __cxa_atexit(std::__cxx11::string::~string,
                 &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                         ::FALSE_VALUE_abi_cxx11_);
  }
  bVar1 = GeneratorProfile::hasInterface(*(GeneratorProfile **)this);
  psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
            ::FALSE_VALUE_abi_cxx11_;
  if (bVar1) {
    psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
              ::TRUE_VALUE_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
  GeneratorProfile::equalityString_abi_cxx11_(&sStack_608,*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::eqString_abi_cxx11_(&local_4c8,*(GeneratorProfile **)this);
  GeneratorProfile::neqString_abi_cxx11_(&local_4e8,*(GeneratorProfile **)this);
  std::operator+(&local_528,&local_4c8,&local_4e8);
  GeneratorProfile::ltString_abi_cxx11_(&local_3c8,*(GeneratorProfile **)this);
  std::operator+(&local_508,&local_528,&local_3c8);
  GeneratorProfile::leqString_abi_cxx11_(&local_3e8,*(GeneratorProfile **)this);
  std::operator+(&local_568,&local_508,&local_3e8);
  GeneratorProfile::gtString_abi_cxx11_(&local_408,*(GeneratorProfile **)this);
  std::operator+(&local_548,&local_568,&local_408);
  GeneratorProfile::geqString_abi_cxx11_(&local_428,*(GeneratorProfile **)this);
  std::operator+(&local_5a8,&local_548,&local_428);
  GeneratorProfile::andString_abi_cxx11_(&local_448,*(GeneratorProfile **)this);
  std::operator+(&local_588,&local_5a8,&local_448);
  GeneratorProfile::orString_abi_cxx11_(&local_468,*(GeneratorProfile **)this);
  std::operator+(&local_5e8,&local_588,&local_468);
  GeneratorProfile::xorString_abi_cxx11_(&local_488,*(GeneratorProfile **)this);
  std::operator+(&local_5c8,&local_5e8,&local_488);
  GeneratorProfile::notString_abi_cxx11_(&local_4a8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_4a8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  bVar1 = GeneratorProfile::hasEqOperator(*(GeneratorProfile **)this);
  bVar2 = GeneratorProfile::hasNeqOperator(*(GeneratorProfile **)this);
  psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
            ::FALSE_VALUE_abi_cxx11_;
  if (bVar1) {
    psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
              ::TRUE_VALUE_abi_cxx11_;
  }
  __rhs = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)::
           FALSE_VALUE_abi_cxx11_;
  if (bVar2) {
    __rhs = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::TRUE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_528,psVar4,__rhs);
  bVar1 = GeneratorProfile::hasLtOperator(*(GeneratorProfile **)this);
  psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
            ::FALSE_VALUE_abi_cxx11_;
  if (bVar1) {
    psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
              ::TRUE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_508,&local_528,psVar4);
  bVar1 = GeneratorProfile::hasLeqOperator(*(GeneratorProfile **)this);
  psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
            ::FALSE_VALUE_abi_cxx11_;
  if (bVar1) {
    psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
              ::TRUE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_568,&local_508,psVar4);
  bVar1 = GeneratorProfile::hasGtOperator(*(GeneratorProfile **)this);
  psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
            ::FALSE_VALUE_abi_cxx11_;
  if (bVar1) {
    psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
              ::TRUE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_548,&local_568,psVar4);
  bVar1 = GeneratorProfile::hasGeqOperator(*(GeneratorProfile **)this);
  psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
            ::FALSE_VALUE_abi_cxx11_;
  if (bVar1) {
    psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
              ::TRUE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_5a8,&local_548,psVar4);
  bVar1 = GeneratorProfile::hasAndOperator(*(GeneratorProfile **)this);
  psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
            ::FALSE_VALUE_abi_cxx11_;
  if (bVar1) {
    psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
              ::TRUE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_588,&local_5a8,psVar4);
  bVar1 = GeneratorProfile::hasOrOperator(*(GeneratorProfile **)this);
  psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
            ::FALSE_VALUE_abi_cxx11_;
  if (bVar1) {
    psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
              ::TRUE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_5e8,&local_588,psVar4);
  bVar1 = GeneratorProfile::hasXorOperator(*(GeneratorProfile **)this);
  psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
            ::FALSE_VALUE_abi_cxx11_;
  if (bVar1) {
    psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
              ::TRUE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_5c8,&local_5e8,psVar4);
  bVar1 = GeneratorProfile::hasNotOperator(*(GeneratorProfile **)this);
  psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
            ::FALSE_VALUE_abi_cxx11_;
  if (bVar1) {
    psVar4 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
              ::TRUE_VALUE_abi_cxx11_;
  }
  std::operator+(&sStack_608,&local_5c8,psVar4);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  GeneratorProfile::plusString_abi_cxx11_(&local_448,*(GeneratorProfile **)this);
  GeneratorProfile::minusString_abi_cxx11_(&local_468,*(GeneratorProfile **)this);
  std::operator+(&local_428,&local_448,&local_468);
  GeneratorProfile::timesString_abi_cxx11_(&local_488,*(GeneratorProfile **)this);
  std::operator+(&local_408,&local_428,&local_488);
  GeneratorProfile::divideString_abi_cxx11_(&local_4a8,*(GeneratorProfile **)this);
  std::operator+(&local_3e8,&local_408,&local_4a8);
  GeneratorProfile::powerString_abi_cxx11_(&local_348,*(GeneratorProfile **)this);
  std::operator+(&local_3c8,&local_3e8,&local_348);
  GeneratorProfile::squareRootString_abi_cxx11_(&local_368,*(GeneratorProfile **)this);
  std::operator+(&local_4e8,&local_3c8,&local_368);
  GeneratorProfile::squareString_abi_cxx11_(&local_388,*(GeneratorProfile **)this);
  std::operator+(&local_4c8,&local_4e8,&local_388);
  GeneratorProfile::absoluteValueString_abi_cxx11_(&local_3a8,*(GeneratorProfile **)this);
  std::operator+(&local_528,&local_4c8,&local_3a8);
  GeneratorProfile::exponentialString_abi_cxx11_(&local_308,*(GeneratorProfile **)this);
  std::operator+(&local_508,&local_528,&local_308);
  GeneratorProfile::naturalLogarithmString_abi_cxx11_(&local_328,*(GeneratorProfile **)this);
  std::operator+(&local_568,&local_508,&local_328);
  GeneratorProfile::commonLogarithmString_abi_cxx11_(&local_248,*(GeneratorProfile **)this);
  std::operator+(&local_548,&local_568,&local_248);
  GeneratorProfile::ceilingString_abi_cxx11_(&local_268,*(GeneratorProfile **)this);
  std::operator+(&local_5a8,&local_548,&local_268);
  GeneratorProfile::floorString_abi_cxx11_(&local_288,*(GeneratorProfile **)this);
  std::operator+(&local_588,&local_5a8,&local_288);
  GeneratorProfile::minString_abi_cxx11_(&local_2a8,*(GeneratorProfile **)this);
  std::operator+(&local_5e8,&local_588,&local_2a8);
  GeneratorProfile::maxString_abi_cxx11_(&local_2c8,*(GeneratorProfile **)this);
  std::operator+(&local_5c8,&local_5e8,&local_2c8);
  GeneratorProfile::remString_abi_cxx11_(&local_2e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_2e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_448);
  GeneratorProfile::hasPowerOperator(*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  GeneratorProfile::sinString_abi_cxx11_(&local_308,*(GeneratorProfile **)this);
  GeneratorProfile::cosString_abi_cxx11_(&local_328,*(GeneratorProfile **)this);
  std::operator+(&local_3a8,&local_308,&local_328);
  GeneratorProfile::tanString_abi_cxx11_(&local_248,*(GeneratorProfile **)this);
  std::operator+(&local_388,&local_3a8,&local_248);
  GeneratorProfile::secString_abi_cxx11_(&local_268,*(GeneratorProfile **)this);
  std::operator+(&local_368,&local_388,&local_268);
  GeneratorProfile::cscString_abi_cxx11_(&local_288,*(GeneratorProfile **)this);
  std::operator+(&local_348,&local_368,&local_288);
  GeneratorProfile::cotString_abi_cxx11_(&local_2a8,*(GeneratorProfile **)this);
  std::operator+(&local_4a8,&local_348,&local_2a8);
  GeneratorProfile::sinhString_abi_cxx11_(&local_2c8,*(GeneratorProfile **)this);
  std::operator+(&local_488,&local_4a8,&local_2c8);
  GeneratorProfile::coshString_abi_cxx11_(&local_2e8,*(GeneratorProfile **)this);
  std::operator+(&local_468,&local_488,&local_2e8);
  GeneratorProfile::tanhString_abi_cxx11_(&local_48,*(GeneratorProfile **)this);
  std::operator+(&local_448,&local_468,&local_48);
  GeneratorProfile::sechString_abi_cxx11_(&local_68,*(GeneratorProfile **)this);
  std::operator+(&local_428,&local_448,&local_68);
  GeneratorProfile::cschString_abi_cxx11_(&local_88,*(GeneratorProfile **)this);
  std::operator+(&local_408,&local_428,&local_88);
  GeneratorProfile::cothString_abi_cxx11_(&local_a8,*(GeneratorProfile **)this);
  std::operator+(&local_3e8,&local_408,&local_a8);
  GeneratorProfile::asinString_abi_cxx11_(&local_c8,*(GeneratorProfile **)this);
  std::operator+(&local_3c8,&local_3e8,&local_c8);
  GeneratorProfile::acosString_abi_cxx11_(&local_e8,*(GeneratorProfile **)this);
  std::operator+(&local_4e8,&local_3c8,&local_e8);
  GeneratorProfile::atanString_abi_cxx11_(&local_108,*(GeneratorProfile **)this);
  std::operator+(&local_4c8,&local_4e8,&local_108);
  GeneratorProfile::asecString_abi_cxx11_(&local_128,*(GeneratorProfile **)this);
  std::operator+(&local_528,&local_4c8,&local_128);
  GeneratorProfile::acscString_abi_cxx11_(&local_148,*(GeneratorProfile **)this);
  std::operator+(&local_508,&local_528,&local_148);
  GeneratorProfile::acotString_abi_cxx11_(&local_168,*(GeneratorProfile **)this);
  std::operator+(&local_568,&local_508,&local_168);
  GeneratorProfile::asinhString_abi_cxx11_(&local_188,*(GeneratorProfile **)this);
  std::operator+(&local_548,&local_568,&local_188);
  GeneratorProfile::acoshString_abi_cxx11_(&local_1a8,*(GeneratorProfile **)this);
  std::operator+(&local_5a8,&local_548,&local_1a8);
  GeneratorProfile::atanhString_abi_cxx11_(&local_1c8,*(GeneratorProfile **)this);
  std::operator+(&local_588,&local_5a8,&local_1c8);
  GeneratorProfile::asechString_abi_cxx11_(&local_1e8,*(GeneratorProfile **)this);
  std::operator+(&local_5e8,&local_588,&local_1e8);
  GeneratorProfile::acschString_abi_cxx11_(&local_208,*(GeneratorProfile **)this);
  std::operator+(&local_5c8,&local_5e8,&local_208);
  GeneratorProfile::acothString_abi_cxx11_(&local_228,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_228);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  GeneratorProfile::conditionalOperatorIfString_abi_cxx11_(&local_588,*(GeneratorProfile **)this);
  GeneratorProfile::conditionalOperatorElseString_abi_cxx11_(&local_5a8,*(GeneratorProfile **)this);
  std::operator+(&local_5e8,&local_588,&local_5a8);
  GeneratorProfile::piecewiseIfString_abi_cxx11_(&local_548,*(GeneratorProfile **)this);
  std::operator+(&local_5c8,&local_5e8,&local_548);
  GeneratorProfile::piecewiseElseString_abi_cxx11_(&local_568,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_568);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_588);
  GeneratorProfile::hasConditionalOperator(*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  GeneratorProfile::trueString_abi_cxx11_(&local_548,*(GeneratorProfile **)this);
  GeneratorProfile::falseString_abi_cxx11_(&local_568,*(GeneratorProfile **)this);
  std::operator+(&local_5a8,&local_548,&local_568);
  GeneratorProfile::eString_abi_cxx11_(&local_508,*(GeneratorProfile **)this);
  std::operator+(&local_588,&local_5a8,&local_508);
  GeneratorProfile::piString_abi_cxx11_(&local_528,*(GeneratorProfile **)this);
  std::operator+(&local_5e8,&local_588,&local_528);
  GeneratorProfile::infString_abi_cxx11_(&local_4c8,*(GeneratorProfile **)this);
  std::operator+(&local_5c8,&local_5e8,&local_4c8);
  GeneratorProfile::nanString_abi_cxx11_(&local_4e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_4e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  GeneratorProfile::eqFunctionString_abi_cxx11_(&local_3c8,*(GeneratorProfile **)this);
  GeneratorProfile::neqFunctionString_abi_cxx11_(&local_3e8,*(GeneratorProfile **)this);
  std::operator+(&local_4e8,&local_3c8,&local_3e8);
  GeneratorProfile::ltFunctionString_abi_cxx11_(&local_408,*(GeneratorProfile **)this);
  std::operator+(&local_4c8,&local_4e8,&local_408);
  GeneratorProfile::leqFunctionString_abi_cxx11_(&local_428,*(GeneratorProfile **)this);
  std::operator+(&local_528,&local_4c8,&local_428);
  GeneratorProfile::gtFunctionString_abi_cxx11_(&local_448,*(GeneratorProfile **)this);
  std::operator+(&local_508,&local_528,&local_448);
  GeneratorProfile::geqFunctionString_abi_cxx11_(&local_468,*(GeneratorProfile **)this);
  std::operator+(&local_568,&local_508,&local_468);
  GeneratorProfile::andFunctionString_abi_cxx11_(&local_488,*(GeneratorProfile **)this);
  std::operator+(&local_548,&local_568,&local_488);
  GeneratorProfile::orFunctionString_abi_cxx11_(&local_4a8,*(GeneratorProfile **)this);
  std::operator+(&local_5a8,&local_548,&local_4a8);
  GeneratorProfile::xorFunctionString_abi_cxx11_(&local_348,*(GeneratorProfile **)this);
  std::operator+(&local_588,&local_5a8,&local_348);
  GeneratorProfile::notFunctionString_abi_cxx11_(&local_368,*(GeneratorProfile **)this);
  std::operator+(&local_5e8,&local_588,&local_368);
  GeneratorProfile::minFunctionString_abi_cxx11_(&local_388,*(GeneratorProfile **)this);
  std::operator+(&local_5c8,&local_5e8,&local_388);
  GeneratorProfile::maxFunctionString_abi_cxx11_(&local_3a8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_3a8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  GeneratorProfile::secFunctionString_abi_cxx11_(&local_3c8,*(GeneratorProfile **)this);
  GeneratorProfile::cscFunctionString_abi_cxx11_(&local_3e8,*(GeneratorProfile **)this);
  std::operator+(&local_4e8,&local_3c8,&local_3e8);
  GeneratorProfile::cotFunctionString_abi_cxx11_(&local_408,*(GeneratorProfile **)this);
  std::operator+(&local_4c8,&local_4e8,&local_408);
  GeneratorProfile::sechFunctionString_abi_cxx11_(&local_428,*(GeneratorProfile **)this);
  std::operator+(&local_528,&local_4c8,&local_428);
  GeneratorProfile::cschFunctionString_abi_cxx11_(&local_448,*(GeneratorProfile **)this);
  std::operator+(&local_508,&local_528,&local_448);
  GeneratorProfile::cothFunctionString_abi_cxx11_(&local_468,*(GeneratorProfile **)this);
  std::operator+(&local_568,&local_508,&local_468);
  GeneratorProfile::asecFunctionString_abi_cxx11_(&local_488,*(GeneratorProfile **)this);
  std::operator+(&local_548,&local_568,&local_488);
  GeneratorProfile::acscFunctionString_abi_cxx11_(&local_4a8,*(GeneratorProfile **)this);
  std::operator+(&local_5a8,&local_548,&local_4a8);
  GeneratorProfile::acotFunctionString_abi_cxx11_(&local_348,*(GeneratorProfile **)this);
  std::operator+(&local_588,&local_5a8,&local_348);
  GeneratorProfile::asechFunctionString_abi_cxx11_(&local_368,*(GeneratorProfile **)this);
  std::operator+(&local_5e8,&local_588,&local_368);
  GeneratorProfile::acschFunctionString_abi_cxx11_(&local_388,*(GeneratorProfile **)this);
  std::operator+(&local_5c8,&local_5e8,&local_388);
  GeneratorProfile::acothFunctionString_abi_cxx11_(&local_3a8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_3a8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  GeneratorProfile::commentString_abi_cxx11_(&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::originCommentString_abi_cxx11_(&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceHeaderString_abi_cxx11_(&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationHeaderString_abi_cxx11_(&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceVersionString_abi_cxx11_(&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationVersionString_abi_cxx11_(&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceLibcellmlVersionString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationLibcellmlVersionString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceStateCountString_abi_cxx11_(&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationStateCountString_abi_cxx11_(&local_5e8,*(GeneratorProfile **)this)
  ;
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceVariableCountString_abi_cxx11_(&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationVariableCountString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (&sStack_608,*(GeneratorProfile **)this,false,false);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (&sStack_608,*(GeneratorProfile **)this,false,true);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (&sStack_608,*(GeneratorProfile **)this,true,false);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (&sStack_608,*(GeneratorProfile **)this,true,true);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_
            (&local_548,*(GeneratorProfile **)this);
  GeneratorProfile::stateVariableTypeString_abi_cxx11_(&local_568,*(GeneratorProfile **)this);
  std::operator+(&local_5a8,&local_548,&local_568);
  GeneratorProfile::constantVariableTypeString_abi_cxx11_(&local_508,*(GeneratorProfile **)this);
  std::operator+(&local_588,&local_5a8,&local_508);
  GeneratorProfile::computedConstantVariableTypeString_abi_cxx11_
            (&local_528,*(GeneratorProfile **)this);
  std::operator+(&local_5e8,&local_588,&local_528);
  GeneratorProfile::algebraicVariableTypeString_abi_cxx11_(&local_4c8,*(GeneratorProfile **)this);
  std::operator+(&local_5c8,&local_5e8,&local_4c8);
  GeneratorProfile::externalVariableTypeString_abi_cxx11_(&local_4e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_4e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  GeneratorProfile::variableInfoObjectString_abi_cxx11_(&sStack_608,*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::interfaceVoiInfoString_abi_cxx11_(&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationVoiInfoString_abi_cxx11_(&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceStateInfoString_abi_cxx11_(&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationStateInfoString_abi_cxx11_(&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceVariableInfoString_abi_cxx11_(&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationVariableInfoString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::variableInfoEntryString_abi_cxx11_(&sStack_608,*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::voiString_abi_cxx11_(&sStack_608,*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::statesArrayString_abi_cxx11_(&local_5e8,*(GeneratorProfile **)this);
  GeneratorProfile::ratesArrayString_abi_cxx11_(&local_588,*(GeneratorProfile **)this);
  std::operator+(&local_5c8,&local_5e8,&local_588);
  GeneratorProfile::variablesArrayString_abi_cxx11_(&local_5a8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5a8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5e8);
  GeneratorProfile::externalVariableMethodTypeDefinitionString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,false);
  GeneratorProfile::externalVariableMethodTypeDefinitionString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,true);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::externalVariableMethodCallString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,false);
  GeneratorProfile::externalVariableMethodCallString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,true);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::rootFindingInfoObjectString_abi_cxx11_
            (&local_3e8,*(GeneratorProfile **)this,false);
  GeneratorProfile::rootFindingInfoObjectString_abi_cxx11_
            (&local_408,*(GeneratorProfile **)this,true);
  std::operator+(&local_3c8,&local_3e8,&local_408);
  GeneratorProfile::externNlaSolveMethodString_abi_cxx11_(&local_428,*(GeneratorProfile **)this);
  std::operator+(&local_4e8,&local_3c8,&local_428);
  GeneratorProfile::findRootCallString_abi_cxx11_(&local_448,*(GeneratorProfile **)this,false);
  std::operator+(&local_4c8,&local_4e8,&local_448);
  GeneratorProfile::findRootCallString_abi_cxx11_(&local_468,*(GeneratorProfile **)this,true);
  std::operator+(&local_528,&local_4c8,&local_468);
  GeneratorProfile::findRootMethodString_abi_cxx11_(&local_488,*(GeneratorProfile **)this,false);
  std::operator+(&local_508,&local_528,&local_488);
  GeneratorProfile::findRootMethodString_abi_cxx11_(&local_4a8,*(GeneratorProfile **)this,true);
  std::operator+(&local_568,&local_508,&local_4a8);
  GeneratorProfile::nlaSolveCallString_abi_cxx11_(&local_348,*(GeneratorProfile **)this,false);
  std::operator+(&local_548,&local_568,&local_348);
  GeneratorProfile::nlaSolveCallString_abi_cxx11_(&local_368,*(GeneratorProfile **)this,true);
  std::operator+(&local_5a8,&local_548,&local_368);
  GeneratorProfile::objectiveFunctionMethodString_abi_cxx11_
            (&local_388,*(GeneratorProfile **)this,false);
  std::operator+(&local_588,&local_5a8,&local_388);
  GeneratorProfile::objectiveFunctionMethodString_abi_cxx11_
            (&local_3a8,*(GeneratorProfile **)this,true);
  std::operator+(&local_5e8,&local_588,&local_3a8);
  GeneratorProfile::uArrayString_abi_cxx11_(&local_308,*(GeneratorProfile **)this);
  std::operator+(&local_5c8,&local_5e8,&local_308);
  GeneratorProfile::fArrayString_abi_cxx11_(&local_328,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_328);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3e8);
  GeneratorProfile::interfaceCreateStatesArrayMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationCreateStatesArrayMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceCreateVariablesArrayMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationCreateVariablesArrayMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceDeleteArrayMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationDeleteArrayMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,false,false);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,false,false);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,false,true);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,false,true);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,true,false);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,true,false);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,true,true);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,true,true);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceComputeComputedConstantsMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationComputeComputedConstantsMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceComputeRatesMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,false);
  GeneratorProfile::implementationComputeRatesMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,false);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceComputeRatesMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,true);
  GeneratorProfile::implementationComputeRatesMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,true);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,false,false);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,false,false);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,false,true);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,false,true);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,true,false);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,true,false);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (&local_5c8,*(GeneratorProfile **)this,true,true);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_5e8,*(GeneratorProfile **)this,true,true);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::emptyMethodString_abi_cxx11_(&sStack_608,*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::indentString_abi_cxx11_(&sStack_608,*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::openArrayInitialiserString_abi_cxx11_(&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::closeArrayInitialiserString_abi_cxx11_(&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::openArrayString_abi_cxx11_(&local_5c8,*(GeneratorProfile **)this);
  GeneratorProfile::closeArrayString_abi_cxx11_(&local_5e8,*(GeneratorProfile **)this);
  std::operator+(&sStack_608,&local_5c8,&local_5e8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  GeneratorProfile::arrayElementSeparatorString_abi_cxx11_(&sStack_608,*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::stringDelimiterString_abi_cxx11_(&sStack_608,*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  GeneratorProfile::commandSeparatorString_abi_cxx11_(&sStack_608,*(GeneratorProfile **)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_608);
  return __return_storage_ptr__;
}

Assistant:

std::string generatorProfileAsString(const GeneratorProfilePtr &generatorProfile)
{
    // Whether the profile requires an interface to be generated.

    static const std::string TRUE_VALUE = "true";
    static const std::string FALSE_VALUE = "false";

    auto profileContents = generatorProfile->hasInterface() ?
                               TRUE_VALUE :
                               FALSE_VALUE;

    // Equality.

    profileContents += generatorProfile->equalityString();

    // Relational and logical operators.

    profileContents += generatorProfile->eqString()
                       + generatorProfile->neqString()
                       + generatorProfile->ltString()
                       + generatorProfile->leqString()
                       + generatorProfile->gtString()
                       + generatorProfile->geqString()
                       + generatorProfile->andString()
                       + generatorProfile->orString()
                       + generatorProfile->xorString()
                       + generatorProfile->notString();

    profileContents += (generatorProfile->hasEqOperator() ?
                            TRUE_VALUE :
                            FALSE_VALUE)
                       + (generatorProfile->hasNeqOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasLtOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasLeqOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasGtOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasGeqOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasAndOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasOrOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasXorOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasNotOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE);

    // Arithmetic operators.

    profileContents += generatorProfile->plusString()
                       + generatorProfile->minusString()
                       + generatorProfile->timesString()
                       + generatorProfile->divideString()
                       + generatorProfile->powerString()
                       + generatorProfile->squareRootString()
                       + generatorProfile->squareString()
                       + generatorProfile->absoluteValueString()
                       + generatorProfile->exponentialString()
                       + generatorProfile->naturalLogarithmString()
                       + generatorProfile->commonLogarithmString()
                       + generatorProfile->ceilingString()
                       + generatorProfile->floorString()
                       + generatorProfile->minString()
                       + generatorProfile->maxString()
                       + generatorProfile->remString();

    profileContents += generatorProfile->hasPowerOperator() ?
                           TRUE_VALUE :
                           FALSE_VALUE;

    // Trigonometric operators.

    profileContents += generatorProfile->sinString()
                       + generatorProfile->cosString()
                       + generatorProfile->tanString()
                       + generatorProfile->secString()
                       + generatorProfile->cscString()
                       + generatorProfile->cotString()
                       + generatorProfile->sinhString()
                       + generatorProfile->coshString()
                       + generatorProfile->tanhString()
                       + generatorProfile->sechString()
                       + generatorProfile->cschString()
                       + generatorProfile->cothString()
                       + generatorProfile->asinString()
                       + generatorProfile->acosString()
                       + generatorProfile->atanString()
                       + generatorProfile->asecString()
                       + generatorProfile->acscString()
                       + generatorProfile->acotString()
                       + generatorProfile->asinhString()
                       + generatorProfile->acoshString()
                       + generatorProfile->atanhString()
                       + generatorProfile->asechString()
                       + generatorProfile->acschString()
                       + generatorProfile->acothString();

    // Piecewise statement.

    profileContents += generatorProfile->conditionalOperatorIfString()
                       + generatorProfile->conditionalOperatorElseString()
                       + generatorProfile->piecewiseIfString()
                       + generatorProfile->piecewiseElseString();

    profileContents += generatorProfile->hasConditionalOperator() ?
                           TRUE_VALUE :
                           FALSE_VALUE;

    // Constants.

    profileContents += generatorProfile->trueString()
                       + generatorProfile->falseString()
                       + generatorProfile->eString()
                       + generatorProfile->piString()
                       + generatorProfile->infString()
                       + generatorProfile->nanString();

    // Arithmetic functions.

    profileContents += generatorProfile->eqFunctionString()
                       + generatorProfile->neqFunctionString()
                       + generatorProfile->ltFunctionString()
                       + generatorProfile->leqFunctionString()
                       + generatorProfile->gtFunctionString()
                       + generatorProfile->geqFunctionString()
                       + generatorProfile->andFunctionString()
                       + generatorProfile->orFunctionString()
                       + generatorProfile->xorFunctionString()
                       + generatorProfile->notFunctionString()
                       + generatorProfile->minFunctionString()
                       + generatorProfile->maxFunctionString();

    // Trigonometric functions.

    profileContents += generatorProfile->secFunctionString()
                       + generatorProfile->cscFunctionString()
                       + generatorProfile->cotFunctionString()
                       + generatorProfile->sechFunctionString()
                       + generatorProfile->cschFunctionString()
                       + generatorProfile->cothFunctionString()
                       + generatorProfile->asecFunctionString()
                       + generatorProfile->acscFunctionString()
                       + generatorProfile->acotFunctionString()
                       + generatorProfile->asechFunctionString()
                       + generatorProfile->acschFunctionString()
                       + generatorProfile->acothFunctionString();

    // Miscellaneous.
    // Note: we do NOT include interfaceFileNameString() since it may be the
    //       only thing that someone might change, so that the generated file
    //       works with the file name it is to be given.

    profileContents += generatorProfile->commentString()
                       + generatorProfile->originCommentString();

    profileContents += generatorProfile->interfaceHeaderString()
                       + generatorProfile->implementationHeaderString();

    profileContents += generatorProfile->interfaceVersionString()
                       + generatorProfile->implementationVersionString();

    profileContents += generatorProfile->interfaceLibcellmlVersionString()
                       + generatorProfile->implementationLibcellmlVersionString();

    profileContents += generatorProfile->interfaceStateCountString()
                       + generatorProfile->implementationStateCountString();

    profileContents += generatorProfile->interfaceVariableCountString()
                       + generatorProfile->implementationVariableCountString();

    profileContents += generatorProfile->variableTypeObjectString(false, false);
    profileContents += generatorProfile->variableTypeObjectString(false, true);
    profileContents += generatorProfile->variableTypeObjectString(true, false);
    profileContents += generatorProfile->variableTypeObjectString(true, true);

    profileContents += generatorProfile->variableOfIntegrationVariableTypeString()
                       + generatorProfile->stateVariableTypeString()
                       + generatorProfile->constantVariableTypeString()
                       + generatorProfile->computedConstantVariableTypeString()
                       + generatorProfile->algebraicVariableTypeString()
                       + generatorProfile->externalVariableTypeString();

    profileContents += generatorProfile->variableInfoObjectString();

    profileContents += generatorProfile->interfaceVoiInfoString()
                       + generatorProfile->implementationVoiInfoString();

    profileContents += generatorProfile->interfaceStateInfoString()
                       + generatorProfile->implementationStateInfoString();

    profileContents += generatorProfile->interfaceVariableInfoString()
                       + generatorProfile->implementationVariableInfoString();

    profileContents += generatorProfile->variableInfoEntryString();

    profileContents += generatorProfile->voiString();

    profileContents += generatorProfile->statesArrayString()
                       + generatorProfile->ratesArrayString()
                       + generatorProfile->variablesArrayString();

    profileContents += generatorProfile->externalVariableMethodTypeDefinitionString(false)
                       + generatorProfile->externalVariableMethodTypeDefinitionString(true);

    profileContents += generatorProfile->externalVariableMethodCallString(false)
                       + generatorProfile->externalVariableMethodCallString(true);

    profileContents += generatorProfile->rootFindingInfoObjectString(false)
                       + generatorProfile->rootFindingInfoObjectString(true)
                       + generatorProfile->externNlaSolveMethodString()
                       + generatorProfile->findRootCallString(false)
                       + generatorProfile->findRootCallString(true)
                       + generatorProfile->findRootMethodString(false)
                       + generatorProfile->findRootMethodString(true)
                       + generatorProfile->nlaSolveCallString(false)
                       + generatorProfile->nlaSolveCallString(true)
                       + generatorProfile->objectiveFunctionMethodString(false)
                       + generatorProfile->objectiveFunctionMethodString(true)
                       + generatorProfile->uArrayString()
                       + generatorProfile->fArrayString();

    profileContents += generatorProfile->interfaceCreateStatesArrayMethodString()
                       + generatorProfile->implementationCreateStatesArrayMethodString();

    profileContents += generatorProfile->interfaceCreateVariablesArrayMethodString()
                       + generatorProfile->implementationCreateVariablesArrayMethodString();

    profileContents += generatorProfile->interfaceDeleteArrayMethodString()
                       + generatorProfile->implementationDeleteArrayMethodString();

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(false, false)
                       + generatorProfile->implementationInitialiseVariablesMethodString(false, false);

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(false, true)
                       + generatorProfile->implementationInitialiseVariablesMethodString(false, true);

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(true, false)
                       + generatorProfile->implementationInitialiseVariablesMethodString(true, false);

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(true, true)
                       + generatorProfile->implementationInitialiseVariablesMethodString(true, true);

    profileContents += generatorProfile->interfaceComputeComputedConstantsMethodString()
                       + generatorProfile->implementationComputeComputedConstantsMethodString();

    profileContents += generatorProfile->interfaceComputeRatesMethodString(false)
                       + generatorProfile->implementationComputeRatesMethodString(false);

    profileContents += generatorProfile->interfaceComputeRatesMethodString(true)
                       + generatorProfile->implementationComputeRatesMethodString(true);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(false, false)
                       + generatorProfile->implementationComputeVariablesMethodString(false, false);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(false, true)
                       + generatorProfile->implementationComputeVariablesMethodString(false, true);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(true, false)
                       + generatorProfile->implementationComputeVariablesMethodString(true, false);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(true, true)
                       + generatorProfile->implementationComputeVariablesMethodString(true, true);

    profileContents += generatorProfile->emptyMethodString();

    profileContents += generatorProfile->indentString();

    profileContents += generatorProfile->openArrayInitialiserString()
                       + generatorProfile->closeArrayInitialiserString();

    profileContents += generatorProfile->openArrayString()
                       + generatorProfile->closeArrayString();

    profileContents += generatorProfile->arrayElementSeparatorString();

    profileContents += generatorProfile->stringDelimiterString();

    profileContents += generatorProfile->commandSeparatorString();

    return profileContents;
}